

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeboneProcess.cpp
# Opt level: O1

void __thiscall Assimp::DeboneProcess::Execute(DeboneProcess *this,aiScene *pScene)

{
  vector<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>_>_>
  *this_00;
  vector<std::pair<unsigned_int,aiNode*>,std::allocator<std::pair<unsigned_int,aiNode*>>> *pvVar1;
  iterator iVar2;
  aiMesh *paVar3;
  bool bVar4;
  Logger *pLVar5;
  size_type __new_size;
  aiMesh **__dest;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  aiMesh *srcMesh;
  vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
  newMeshes;
  vector<bool,_std::allocator<bool>_> splitList;
  pair<unsigned_int,_aiNode_*> push_pair;
  void *local_248;
  iterator iStack_240;
  aiMesh **local_238;
  aiMesh *local_230;
  vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
  local_228;
  vector<bool,_std::allocator<bool>_> local_210;
  ulong local_1e8;
  long *local_1e0 [2];
  long local_1d0 [2];
  Logger *local_1c0;
  DeboneProcess *local_1b8;
  ulong local_1b0;
  undefined1 local_1a8 [8];
  aiNode *paStack_1a0;
  ios_base local_138 [264];
  
  pLVar5 = DefaultLogger::get();
  Logger::debug(pLVar5,"DeboneProcess begin");
  if ((ulong)pScene->mNumMeshes != 0) {
    local_1a8._0_4_ = local_1a8._0_4_ & 0xffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              (&local_210,(ulong)pScene->mNumMeshes,(bool *)local_1a8,(allocator_type *)local_1e0);
    __new_size = (size_type)pScene->mNumMeshes;
    if (pScene->mNumMeshes != 0) {
      uVar9 = 0;
      do {
        bVar4 = ConsiderMesh(this,pScene->mMeshes[uVar9]);
        uVar7 = uVar9 >> 6;
        uVar8 = 1L << ((byte)uVar9 & 0x3f);
        if (bVar4) {
          uVar8 = uVar8 | local_210.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar7];
        }
        else {
          uVar8 = ~uVar8 & local_210.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar7];
        }
        local_210.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[uVar7] = uVar8;
        uVar9 = uVar9 + 1;
        __new_size = (size_type)pScene->mNumMeshes;
      } while (uVar9 < __new_size);
    }
    if ((this->mNumBonesCanDoWithout != 0) &&
       ((int)__new_size != 0 &&
        (this->mNumBonesCanDoWithout != this->mNumBones & this->mAllOrNone) == 0)) {
      uVar9 = 0;
      iVar6 = 0;
      do {
        iVar6 = iVar6 + (uint)((local_210.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                [uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0);
        uVar9 = uVar9 + 1;
      } while (__new_size != uVar9);
      if (iVar6 != 0) {
        this_00 = &this->mSubMeshIndices;
        std::
        vector<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>_>_>
        ::resize(this_00,__new_size);
        local_248 = (void *)0x0;
        iStack_240._M_current = (aiMesh **)0x0;
        local_238 = (aiMesh **)0x0;
        if (pScene->mNumMeshes != 0) {
          uVar9 = 0;
          local_1b8 = this;
          do {
            local_230 = pScene->mMeshes[uVar9];
            local_228.
            super__Vector_base<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_228.
            super__Vector_base<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_228.
            super__Vector_base<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if ((local_210.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar9 >> 6] >>
                 (uVar9 & 0x3f) & 1) != 0) {
              SplitMesh(this,local_230,&local_228);
            }
            if (local_228.
                super__Vector_base<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                local_228.
                super__Vector_base<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              pvVar1 = (vector<std::pair<unsigned_int,aiNode*>,std::allocator<std::pair<unsigned_int,aiNode*>>>
                        *)((this_00->
                           super__Vector_base<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + uVar9);
              local_1a8._0_4_ =
                   (undefined4)((ulong)((long)iStack_240._M_current - (long)local_248) >> 3);
              paStack_1a0 = (aiNode *)0x0;
              iVar2._M_current = *(pair<unsigned_int,_aiNode_*> **)(pvVar1 + 8);
              if (iVar2._M_current == *(pair<unsigned_int,_aiNode_*> **)(pvVar1 + 0x10)) {
                std::
                vector<std::pair<unsigned_int,aiNode*>,std::allocator<std::pair<unsigned_int,aiNode*>>>
                ::_M_realloc_insert<std::pair<unsigned_int,aiNode*>>
                          (pvVar1,iVar2,(pair<unsigned_int,_aiNode_*> *)local_1a8);
              }
              else {
                *(ulong *)iVar2._M_current = CONCAT44(local_1a8._4_4_,local_1a8._0_4_);
                (iVar2._M_current)->second = (aiNode *)0x0;
                *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 0x10;
              }
              if (iStack_240._M_current == local_238) {
                std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                          ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_248,iStack_240,
                           &local_230);
              }
              else {
                *iStack_240._M_current = local_230;
                iStack_240._M_current = iStack_240._M_current + 1;
              }
            }
            else {
              local_1b0 = (ulong)local_230->mNumBones;
              local_1e8 = uVar9;
              if (local_228.
                  super__Vector_base<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  local_228.
                  super__Vector_base<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                uVar7 = 0;
                uVar8 = 1;
                do {
                  if (local_228.
                      super__Vector_base<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar7].second == (aiBone *)0x0) {
                    paStack_1a0 = (aiNode *)0x0;
                  }
                  else {
                    paStack_1a0 = aiNode::FindNode(pScene->mRootNode,
                                                   ((local_228.
                                                                                                          
                                                  super__Vector_base<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar7].
                                                  second)->mName).data);
                  }
                  local_1a8._0_4_ =
                       (undefined4)((ulong)((long)iStack_240._M_current - (long)local_248) >> 3);
                  pvVar1 = (vector<std::pair<unsigned_int,aiNode*>,std::allocator<std::pair<unsigned_int,aiNode*>>>
                            *)((this_00->
                               super__Vector_base<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + uVar9);
                  iVar2._M_current = *(pair<unsigned_int,_aiNode_*> **)(pvVar1 + 8);
                  if (iVar2._M_current == *(pair<unsigned_int,_aiNode_*> **)(pvVar1 + 0x10)) {
                    std::
                    vector<std::pair<unsigned_int,aiNode*>,std::allocator<std::pair<unsigned_int,aiNode*>>>
                    ::_M_realloc_insert<std::pair<unsigned_int,aiNode*>const&>
                              (pvVar1,iVar2,(pair<unsigned_int,_aiNode_*> *)local_1a8);
                  }
                  else {
                    *(ulong *)iVar2._M_current = CONCAT44(local_1a8._4_4_,local_1a8._0_4_);
                    (iVar2._M_current)->second = paStack_1a0;
                    *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 0x10;
                  }
                  if (iStack_240._M_current == local_238) {
                    std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                              ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_248,iStack_240,
                               &local_228.
                                super__Vector_base<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar7].first);
                  }
                  else {
                    *iStack_240._M_current =
                         local_228.
                         super__Vector_base<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar7].first;
                    iStack_240._M_current = iStack_240._M_current + 1;
                  }
                  bVar4 = uVar8 < (ulong)((long)local_228.
                                                super__Vector_base<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_228.
                                                super__Vector_base<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 4);
                  uVar7 = uVar8;
                  uVar8 = (ulong)((int)uVar8 + 1);
                } while (bVar4);
              }
              bVar4 = DefaultLogger::isNullLogger();
              this = local_1b8;
              uVar9 = local_1e8;
              if (!bVar4) {
                local_1c0 = DefaultLogger::get();
                Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                basic_formatter<char[31]>
                          ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a8,(char (*) [31])"Removed %u bones. Input bones:");
                std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,". Output bones: ",0x10);
                std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                std::__cxx11::stringbuf::str();
                Logger::info(local_1c0,(char *)local_1e0[0]);
                if (local_1e0[0] != local_1d0) {
                  operator_delete(local_1e0[0],local_1d0[0] + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                std::ios_base::~ios_base(local_138);
              }
              paVar3 = local_230;
              if (local_230 != (aiMesh *)0x0) {
                aiMesh::~aiMesh(local_230);
                operator_delete(paVar3,0x520);
              }
            }
            if (local_228.
                super__Vector_base<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_228.
                              super__Vector_base<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_228.
                                    super__Vector_base<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_228.
                                    super__Vector_base<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 < pScene->mNumMeshes);
        }
        pScene->mNumMeshes = (uint)((ulong)((long)iStack_240._M_current - (long)local_248) >> 3);
        if (pScene->mMeshes != (aiMesh **)0x0) {
          operator_delete__(pScene->mMeshes);
        }
        __dest = (aiMesh **)operator_new__((ulong)pScene->mNumMeshes << 3);
        pScene->mMeshes = __dest;
        if ((long)iStack_240._M_current - (long)local_248 != 0) {
          memmove(__dest,local_248,(long)iStack_240._M_current - (long)local_248);
        }
        UpdateNode(this,pScene->mRootNode);
        if (local_248 != (void *)0x0) {
          operator_delete(local_248,(long)local_238 - (long)local_248);
        }
      }
    }
    pLVar5 = DefaultLogger::get();
    Logger::debug(pLVar5,"DeboneProcess end");
    if (local_210.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_210.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_210.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_210.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
  }
  return;
}

Assistant:

void DeboneProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("DeboneProcess begin");

    if(!pScene->mNumMeshes) {
        return;
    }

    std::vector<bool> splitList(pScene->mNumMeshes);
    for( unsigned int a = 0; a < pScene->mNumMeshes; a++) {
        splitList[a] = ConsiderMesh( pScene->mMeshes[a] );
    }

    int numSplits = 0;

    if(!!mNumBonesCanDoWithout && (!mAllOrNone||mNumBonesCanDoWithout==mNumBones))  {
        for(unsigned int a = 0; a < pScene->mNumMeshes; a++)    {
            if(splitList[a]) {
                numSplits++;
            }
        }
    }

    if(numSplits)   {
        // we need to do something. Let's go.
        //mSubMeshIndices.clear();                  // really needed?
        mSubMeshIndices.resize(pScene->mNumMeshes); // because we're doing it here anyway

        // build a new array of meshes for the scene
        std::vector<aiMesh*> meshes;

        for(unsigned int a=0;a<pScene->mNumMeshes;a++)
        {
            aiMesh* srcMesh = pScene->mMeshes[a];

            std::vector<std::pair<aiMesh*,const aiBone*> > newMeshes;

            if(splitList[a]) {
                SplitMesh(srcMesh,newMeshes);
            }

            // mesh was split
            if(!newMeshes.empty())  {
                unsigned int out = 0, in = srcMesh->mNumBones;

                // store new meshes and indices of the new meshes
                for(unsigned int b=0;b<newMeshes.size();b++)    {
                    const aiString *find = newMeshes[b].second?&newMeshes[b].second->mName:0;

                    aiNode *theNode = find?pScene->mRootNode->FindNode(*find):0;
                    std::pair<unsigned int,aiNode*> push_pair(static_cast<unsigned int>(meshes.size()),theNode);

                    mSubMeshIndices[a].push_back(push_pair);
                    meshes.push_back(newMeshes[b].first);

                    out+=newMeshes[b].first->mNumBones;
                }

                if(!DefaultLogger::isNullLogger()) {
                    ASSIMP_LOG_INFO_F("Removed %u bones. Input bones:", in - out, ". Output bones: ", out);
                }

                // and destroy the source mesh. It should be completely contained inside the new submeshes
                delete srcMesh;
            }
            else    {
                // Mesh is kept unchanged - store it's new place in the mesh array
                mSubMeshIndices[a].push_back(std::pair<unsigned int,aiNode*>(static_cast<unsigned int>(meshes.size()),(aiNode*)0));
                meshes.push_back(srcMesh);
            }
        }

        // rebuild the scene's mesh array
        pScene->mNumMeshes = static_cast<unsigned int>(meshes.size());
        delete [] pScene->mMeshes;
        pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
        std::copy( meshes.begin(), meshes.end(), pScene->mMeshes);

        // recurse through all nodes and translate the node's mesh indices to fit the new mesh array
        UpdateNode( pScene->mRootNode);
    }

    ASSIMP_LOG_DEBUG("DeboneProcess end");
}